

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::convert_non_uniform_expression
          (CompilerGLSL *this,string *expr,uint32_t ptr_id)

{
  ulong uVar1;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  ulong uVar4;
  int iVar5;
  pointer pcVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  if ((((*(this->backend).nonuniform_qualifier == '\0') ||
       (pSVar2 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr_id),
       pSVar2 == (SPIRVariable *)0x0)) || (StorageBuffer < pSVar2->storage)) ||
     ((((0x1005U >> (pSVar2->storage & 0x1f) & 1) == 0 ||
       (pSVar3 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(pSVar2->super_IVariant).field_0xc),
       (pSVar3->array).super_VectorView<unsigned_int>.buffer_size == 0)) ||
      (uVar4 = ::std::__cxx11::string::find((char)expr,0x5b), uVar4 == 0xffffffffffffffff)))) {
    return;
  }
  uVar1 = uVar4 + 1;
  if (uVar1 < expr->_M_string_length) {
    pcVar6 = (expr->_M_dataplus)._M_p;
    iVar5 = 1;
    lVar7 = 0;
    do {
      if (pcVar6[uVar1] == ']') {
        iVar5 = iVar5 + -1;
        if (iVar5 == 0) {
          if (uVar1 - lVar7 < uVar4) {
            return;
          }
          ::std::__cxx11::string::substr((ulong)local_88,(ulong)expr);
          ::std::__cxx11::string::substr((ulong)local_a8,(ulong)expr);
          ::std::__cxx11::string::substr((ulong)local_68,(ulong)expr);
          join<std::__cxx11::string,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                    (&local_48,(spirv_cross *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(this->backend).nonuniform_qualifier,(char **)0x3fb721,(char (*) [2])local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x406dab,
                     (char (*) [2])local_68,in_stack_ffffffffffffff50);
          ::std::__cxx11::string::operator=((string *)expr,(string *)&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
          if (local_68[0] != local_58) {
            operator_delete(local_68[0]);
          }
          if (local_a8[0] != local_98) {
            operator_delete(local_a8[0]);
          }
          if (local_88[0] == local_78) {
            return;
          }
          operator_delete(local_88[0]);
          return;
        }
      }
      else {
        iVar5 = iVar5 + (uint)(pcVar6[uVar1] == '[');
      }
      lVar7 = lVar7 + -1;
      pcVar6 = pcVar6 + 1;
    } while (uVar1 - expr->_M_string_length != lVar7);
    if (iVar5 == 0) {
      return;
    }
  }
  __assert_fail("bracket_count == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                ,0x4767,
                "void spirv_cross::CompilerGLSL::convert_non_uniform_expression(string &, uint32_t)"
               );
}

Assistant:

void CompilerGLSL::convert_non_uniform_expression(string &expr, uint32_t ptr_id)
{
	if (*backend.nonuniform_qualifier == '\0')
		return;

	auto *var = maybe_get_backing_variable(ptr_id);
	if (!var)
		return;

	if (var->storage != StorageClassUniformConstant &&
	    var->storage != StorageClassStorageBuffer &&
	    var->storage != StorageClassUniform)
		return;

	auto &backing_type = get<SPIRType>(var->basetype);
	if (backing_type.array.empty())
		return;

	// If we get here, we know we're accessing an arrayed resource which
	// might require nonuniform qualifier.

	auto start_array_index = expr.find_first_of('[');

	if (start_array_index == string::npos)
		return;

	// We've opened a bracket, track expressions until we can close the bracket.
	// This must be our resource index.
	size_t end_array_index = string::npos;
	unsigned bracket_count = 1;
	for (size_t index = start_array_index + 1; index < expr.size(); index++)
	{
		if (expr[index] == ']')
		{
			if (--bracket_count == 0)
			{
				end_array_index = index;
				break;
			}
		}
		else if (expr[index] == '[')
			bracket_count++;
	}

	assert(bracket_count == 0);

	// Doesn't really make sense to declare a non-arrayed image with nonuniformEXT, but there's
	// nothing we can do here to express that.
	if (start_array_index == string::npos || end_array_index == string::npos || end_array_index < start_array_index)
		return;

	start_array_index++;

	expr = join(expr.substr(0, start_array_index), backend.nonuniform_qualifier, "(",
	            expr.substr(start_array_index, end_array_index - start_array_index), ")",
	            expr.substr(end_array_index, string::npos));
}